

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Object::~Object(Object *this)

{
  Finalizer *this_00;
  _Manager_type UNRECOVERED_JUMPTABLE;
  
  this->_vptr_Object = (_func_int **)&PTR__Object_0017fe80;
  if ((this->finalizer_).super__Function_base._M_manager != (_Manager_type)0x0) {
    this_00 = &this->finalizer_;
    std::function<void_(wabt::interp::Object_*)>::operator()(this_00,this);
    UNRECOVERED_JUMPTABLE = (this->finalizer_).super__Function_base._M_manager;
    if (UNRECOVERED_JUMPTABLE != (_Manager_type)0x0) {
      (*UNRECOVERED_JUMPTABLE)((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      return;
    }
  }
  return;
}

Assistant:

Object::~Object() {
  if (finalizer_) {
    finalizer_(this);
  }
}